

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O0

void __thiscall Interpreter::run(Interpreter *this)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  long *plVar4;
  code *local_58;
  Call c;
  unsigned_long size;
  Interpreter *this_local;
  
  sVar2 = std::vector<Interpreter::Call,_std::allocator<Interpreter::Call>_>::size(&this->callList);
  while (this->currentOp < sVar2) {
    uVar1 = this->currentOp;
    this->currentOp = uVar1 + 1;
    pvVar3 = std::vector<Interpreter::Call,_std::allocator<Interpreter::Call>_>::operator[]
                       (&this->callList,(ulong)uVar1);
    local_58 = (code *)pvVar3->func;
    plVar4 = (long *)((long)&this->res + *(long *)&pvVar3->field_0x8);
    if (((ulong)local_58 & 1) != 0) {
      local_58 = *(code **)(local_58 + *plVar4 + -1);
    }
    (*local_58)(plVar4,pvVar3->data);
  }
  return;
}

Assistant:

void Interpreter::run() {
    unsigned long size = callList.size();
    while (currentOp < size) {
        Call c = callList[currentOp++];
        (this->*c.func)(c.data);
    }
}